

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

bool __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::try_push
          (iterator *this,olc_node_ptr node,byte key_byte,uint8_t child_index,
          key_prefix_snapshot prefix,read_critical_section *rcs)

{
  key_view v;
  stack_entry local_40;
  key_prefix_snapshot local_20;
  key_prefix_snapshot prefix_local;
  
  local_20 = prefix;
  if ((node.tagged_ptr & 7) != 0) {
    local_40.version = (rcs->version).version;
    local_40.super_iter_result.node.tagged_ptr = node.tagged_ptr;
    local_40.super_iter_result.key_byte = key_byte;
    local_40.super_iter_result.child_index = child_index;
    local_40.super_iter_result.prefix = prefix;
    std::
    deque<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
    ::
    emplace_back<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>
              ((deque<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
                *)&this->stack_,&local_40);
    v._M_extent._M_extent_value._0_1_ = local_20.f.key_prefix_length;
    v._M_ptr = (pointer)&local_20;
    v._M_extent._M_extent_value._1_7_ = 0;
    detail::key_buffer::push(&this->keybuf_,v);
    detail::key_buffer::push(&this->keybuf_,key_byte);
    return true;
  }
  __assert_fail("node.type() != node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x1bd,
                "bool unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::try_push(detail::olc_node_ptr, std::byte, std::uint8_t, detail::key_prefix_snapshot, const optimistic_lock::read_critical_section &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

bool try_push(detail::olc_node_ptr node, std::byte key_byte,
                  std::uint8_t child_index, detail::key_prefix_snapshot prefix,
                  const optimistic_lock::read_critical_section& rcs) {
      // For variable length keys we need to know the number of bytes
      // associated with the node's key_prefix.  In addition there is
      // one byte for the descent to the child node along the
      // child_index.  That information needs to be stored on the
      // stack so we can pop off the right number of bytes even for
      // OLC where the node might be concurrently modified.
      UNODB_DETAIL_ASSERT(node.type() != node_type::LEAF);
      stack_.push({{node, key_byte, child_index, prefix}, rcs.get()});
      keybuf_.push(prefix.get_key_view());
      keybuf_.push(key_byte);
      return true;
    }